

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O1

Texture2DArray * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture2DArray>
          (FboBuilder *this)

{
  Texture2DArray *pTVar1;
  Texture2DArray *local_18;
  
  pTVar1 = (Texture2DArray *)operator_new(0x20);
  (pTVar1->super_TextureLayered).super_Texture.super_Image.width = 0;
  (pTVar1->super_TextureLayered).super_Texture.super_Image.height = 0;
  *(undefined8 *)&(pTVar1->super_TextureLayered).super_Texture.numLevels = 0;
  (pTVar1->super_TextureLayered).super_Texture.super_Image.super_Config._vptr_Config =
       (_func_int **)0x0;
  (pTVar1->super_TextureLayered).super_Texture.super_Image.internalFormat.format = 0;
  (pTVar1->super_TextureLayered).super_Texture.super_Image.internalFormat.unsizedType = 0;
  *(undefined1 **)&(pTVar1->super_TextureLayered).super_Texture.numLevels = &DAT_100000001;
  (pTVar1->super_TextureLayered).super_Texture.super_Image.super_Config._vptr_Config =
       (_func_int **)&PTR__Config_0218fb18;
  local_18 = pTVar1;
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
            ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&this->m_configs,(Config **)&local_18);
  return pTVar1;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}